

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::set_name(FieldDescriptorProto *this,char *value)

{
  char *pcVar1;
  LogMessage *other;
  string *default_value;
  allocator local_89;
  string local_88;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  char *local_18;
  char *value_local;
  FieldDescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = value;
  value_local = (char *)this;
  if (value == (char *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x143d);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: value != NULL: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  set_has_name(this);
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
  internal::ArenaStringPtr::SetNoArena(&this->name_,default_value,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

inline void FieldDescriptorProto::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_name();
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.FieldDescriptorProto.name)
}